

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MVert>
          (Structure *this,MVert *dest,FileDatabase *db)

{
  ReadFieldArray<2,float,3ul>(this,&dest->co,"co",db);
  ReadFieldArray<2,float,3ul>(this,&dest->no,"no",db);
  ReadField<1,char>(this,&dest->flag,"flag",db);
  ReadField<1,int>(this,&dest->bweight,"bweight",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MVert> (
    MVert& dest,
    const FileDatabase& db
    ) const
{

    ReadFieldArray<ErrorPolicy_Fail>(dest.co,"co",db);
    ReadFieldArray<ErrorPolicy_Fail>(dest.no,"no",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    //ReadField<ErrorPolicy_Warn>(dest.mat_nr,"mat_nr",db);
    ReadField<ErrorPolicy_Igno>(dest.bweight,"bweight",db);

    db.reader->IncPtr(size);
}